

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

int ghc::filesystem::remove(char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined7 extraout_var;
  undefined8 uVar3;
  path *in_stack_00000020;
  string *in_stack_00000028;
  filesystem_error *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  bool result;
  error_code ec;
  int in_stack_000001dc;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  error_code local_18;
  filesystem *local_8;
  
  local_8 = (filesystem *)__filename;
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  iVar2 = remove(local_8,(char *)&local_18);
  bVar1 = std::error_code::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    return (uint)CONCAT71(extraout_var,(char)iVar2) & 0xffffff01;
  }
  uVar3 = __cxa_allocate_exception(0x90);
  std::error_code::value(&local_18);
  detail::systemErrorText<int>(in_stack_000001dc);
  filesystem_error::filesystem_error
            (in_stack_00000030,in_stack_00000028,in_stack_00000020,(error_code)in_stack_00000038);
  __cxa_throw(uVar3,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
}

Assistant:

GHC_INLINE bool remove(const path& p)
{
    std::error_code ec;
    auto result = remove(p, ec);
    if (ec) {
        throw filesystem_error(detail::systemErrorText(ec.value()), p, ec);
    }
    return result;
}